

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

int TextStartsWithWhitespace(Lexer *lexer,Node *node,uint start,uint mode)

{
  uint uVar1;
  Bool BVar2;
  uint uVar3;
  ulong uVar4;
  
  if (node == (Node *)0x0) {
    __assert_fail("node != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/pprint.c"
                  ,0x71c,"int TextStartsWithWhitespace(Lexer *, Node *, uint, uint)");
  }
  if (((mode & 0x12) != 0) &&
     ((BVar2 = prvTidynodeIsText(node), BVar2 != no || ((node->type - AspTag & 0xfffffffd) == 0))))
  {
    uVar1 = node->end;
    if (node->start <= start && node->start < uVar1) {
      uVar4 = (ulong)start;
      uVar3 = start;
      if (start < uVar1) {
        uVar3 = uVar1;
      }
      for (; uVar4 < uVar1; uVar4 = uVar4 + 1) {
        if ((0x20 < (ulong)(byte)lexer->lexbuf[uVar4]) ||
           ((0x100002200U >> ((ulong)(byte)lexer->lexbuf[uVar4] & 0x3f) & 1) == 0)) {
          uVar3 = (uint)uVar4;
          break;
        }
      }
      if (start <= uVar3 && uVar3 - start != 0) {
        return uVar3 - start;
      }
    }
  }
  return -1;
}

Assistant:

static int TextStartsWithWhitespace( Lexer *lexer, Node *node, uint start, uint mode )
{
    assert( node != NULL );
    if ( (mode & (CDATA|COMMENT)) && TY_(nodeIsTextLike)(node) && node->end > node->start && start >= node->start )
    {
        uint ch, ix = start;
        /* Skip whitespace. */
        while ( ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && ( ch==' ' || ch=='\t' || ch=='\r' ) )
            ++ix;

        if ( ix > start )
          return ix - start;
    }
    return -1;
}